

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O3

int qpdf_find_page_by_id(qpdf_data qpdf,int objid,int generation)

{
  uint uVar1;
  int iVar2;
  int n;
  QPDFObjGen og;
  int local_34;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  int local_10;
  int local_c;
  
  local_30._M_unused._M_object = &local_34;
  local_34 = -1;
  local_30._8_8_ = &local_10;
  local_18 = std::
             _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1844:27)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1844:27)>
             ::_M_manager;
  local_10 = objid;
  local_c = generation;
  uVar1 = trap_errors(qpdf,(function<void_(_qpdf_data_*)> *)&local_30);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  iVar2 = -1;
  if (uVar1 < 2) {
    iVar2 = local_34;
  }
  return iVar2;
}

Assistant:

int
qpdf_find_page_by_id(qpdf_data qpdf, int objid, int generation)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_find_page_by_id");
    int n = -1;
    QPDFObjGen og(objid, generation);
    QPDF_ERROR_CODE code =
        trap_errors(qpdf, [&n, &og](qpdf_data q) { n = QIntC::to_int(q->qpdf->findPage(og)); });
    if (code & QPDF_ERRORS) {
        return -1;
    }
    return n;
}